

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall Loop::EnsureMemOpVariablesInitialized(Loop *this)

{
  JitArenaAllocator *alloc;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Func *pFVar4;
  MemOpInfo *pMVar5;
  InductionVariableChangeInfoMap *pIVar6;
  InductionVariableOpndPerUnrollMap *pIVar7;
  MemOpList *pMVar8;
  
  if ((this->field_0x179 & 4) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x53c,"(this->doMemOp)","this->doMemOp");
    if (!bVar2) goto LAB_003fb7f3;
    *puVar3 = 0;
  }
  if (this->memOpInfo == (MemOpInfo *)0x0) {
    pFVar4 = GetFunc(this);
    alloc = pFVar4->topFunc->m_fg->alloc;
    pMVar5 = (MemOpInfo *)new<Memory::JitArenaAllocator>(0x48,alloc,0x3d6ef4);
    this->memOpInfo = pMVar5;
    pMVar5->inductionVariablesUsedAfterLoop = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    pMVar5->startIndexOpndCache[0] = (RegOpnd *)0x0;
    this->memOpInfo->startIndexOpndCache[1] = (RegOpnd *)0x0;
    this->memOpInfo->startIndexOpndCache[2] = (RegOpnd *)0x0;
    this->memOpInfo->startIndexOpndCache[3] = (RegOpnd *)0x0;
    pIVar6 = (InductionVariableChangeInfoMap *)new<Memory::JitArenaAllocator>(0x38,alloc,0x3d6ef4);
    pIVar6->buckets = (Type)0x0;
    pIVar6->entries = (Type)0x0;
    pIVar6->alloc = alloc;
    pIVar6->size = 0;
    pIVar6->bucketCount = 0;
    pIVar6->count = 0;
    pIVar6->freeCount = 0;
    pIVar6->modFunctionIndex = 0x4b;
    if (alloc == (JitArenaAllocator *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x8e,"(allocator)","allocator");
      if (!bVar2) goto LAB_003fb7f3;
      *puVar3 = 0;
    }
    pIVar6->stats = (Type)0x0;
    this->memOpInfo->inductionVariableChangeInfoMap = pIVar6;
    pIVar7 = (InductionVariableOpndPerUnrollMap *)
             new<Memory::JitArenaAllocator>(0x38,alloc,0x3d6ef4);
    pIVar7->size = 0;
    pIVar7->bucketCount = 0;
    pIVar7->count = 0;
    pIVar7->buckets = (Type)0x0;
    pIVar7->entries = (Type)0x0;
    pIVar7->alloc = alloc;
    pIVar7->freeCount = 0;
    pIVar7->modFunctionIndex = 0x4b;
    if (alloc == (JitArenaAllocator *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x8e,"(allocator)","allocator");
      if (!bVar2) {
LAB_003fb7f3:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    pIVar7->stats = (Type)0x0;
    this->memOpInfo->inductionVariableOpndPerUnrollMap = pIVar7;
    pMVar8 = (MemOpList *)new<Memory::JitArenaAllocator>(0x18,alloc,0x3d6ef4);
    (pMVar8->super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>).
    super_SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>.
    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pMVar8;
    ((RealCount *)
    ((long)&(pMVar8->super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>).
            super_SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> + 8))->count
         = 0;
    (pMVar8->super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>).allocator =
         &alloc->super_ArenaAllocator;
    this->memOpInfo->candidates = pMVar8;
  }
  return;
}

Assistant:

void
Loop::EnsureMemOpVariablesInitialized()
{
    Assert(this->doMemOp);
    if (this->memOpInfo == nullptr)
    {
        JitArenaAllocator *allocator = this->GetFunc()->GetTopFunc()->m_fg->alloc;
        this->memOpInfo = JitAnewStruct(allocator, Loop::MemOpInfo);
        this->memOpInfo->inductionVariablesUsedAfterLoop = nullptr;
        this->memOpInfo->startIndexOpndCache[0] = nullptr;
        this->memOpInfo->startIndexOpndCache[1] = nullptr;
        this->memOpInfo->startIndexOpndCache[2] = nullptr;
        this->memOpInfo->startIndexOpndCache[3] = nullptr;
        this->memOpInfo->inductionVariableChangeInfoMap = JitAnew(allocator, Loop::InductionVariableChangeInfoMap, allocator);
        this->memOpInfo->inductionVariableOpndPerUnrollMap = JitAnew(allocator, Loop::InductionVariableOpndPerUnrollMap, allocator);
        this->memOpInfo->candidates = JitAnew(allocator, Loop::MemOpList, allocator);
    }
}